

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

QFontEngine *
QFontDatabasePrivate::loadSingleEngine
          (int script,QFontDef *request,QtFontFamily *family,QtFontFoundry *foundry,
          QtFontStyle *style,QtFontSize *size)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  uchar uVar4;
  uint3 uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  QFontCache *this;
  QFontEngine *this_00;
  ulong uVar10;
  QFontEngine *pQVar11;
  undefined8 uVar12;
  long lVar13;
  undefined8 *puVar14;
  QArrayDataPointer<QString> *pQVar15;
  Key *pKVar16;
  uint uVar17;
  long in_FS_OFFSET;
  byte bVar18;
  QStringView QVar19;
  QStringView QVar20;
  char local_130 [24];
  char *local_118;
  QArrayDataPointer<QString> local_110;
  QArrayData *local_f8;
  char16_t *local_f0;
  qsizetype qStack_e8;
  QArrayDataPointer<QString> local_e0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
  local_c8;
  qreal local_c0;
  double dStack_b8;
  ulong local_b0;
  Key key;
  long *plVar9;
  
  bVar18 = 0;
  uVar4 = (uchar)script;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  plVar9 = (long *)CONCAT44(extraout_var,iVar8);
  uVar1 = *(ushort *)&size->field_0x8;
  uVar17 = (uint)uVar1;
  if ((uVar1 == 0) ||
     (((uVar1 == 0xffff && ((*(uint *)&style->field_0x4 & 2) != 0)) ||
      (cVar6 = (**(code **)(*plVar9 + 0x80))(plVar9), cVar6 != '\0')))) {
    uVar17 = (uint)request->pixelSize;
  }
  puVar14 = &DAT_006b7eb0;
  pQVar15 = &local_110;
  for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
    pQVar15->d = (Data *)*puVar14;
    puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
    pQVar15 = (QArrayDataPointer<QString> *)((long)pQVar15 + ((ulong)bVar18 * -2 + 1) * 8);
  }
  local_110.d = (request->families).d.d;
  local_110.ptr = (request->families).d.ptr;
  local_110.size = (request->families).d.size;
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_f8 = &((request->styleName).d.d)->super_QArrayData;
  local_f0 = (request->styleName).d.ptr;
  qStack_e8 = (request->styleName).d.size;
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_f8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_f8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e0.d = (request->fallBackFamilies).d.d;
  local_e0.ptr = (request->fallBackFamilies).d.ptr;
  local_e0.size = (request->fallBackFamilies).d.size;
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_*>
        )(request->variableAxisValues).d.d.ptr;
  if (local_c8.d.ptr !=
      (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
       *)0x0) {
    LOCK();
    (((QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
       *)local_c8.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                        *)local_c8.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_c0 = request->pointSize;
  local_b0 = *(ulong *)&request->field_0x60;
  dStack_b8 = (double)(int)uVar17;
  this = QFontCache::instance();
  puVar14 = &DAT_006b7e40;
  pKVar16 = &key;
  for (lVar13 = 0xe; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pKVar16->def).families.d.d = (Data *)*puVar14;
    puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
    pKVar16 = (Key *)((long)pKVar16 + (ulong)bVar18 * -0x10 + 8);
  }
  key.def.families.d.d = local_110.d;
  key.def.families.d.ptr = local_110.ptr;
  key.def.families.d.size = local_110.size;
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  key.def.styleName.d.d = (Data *)local_f8;
  key.def.styleName.d.ptr = local_f0;
  key.def.styleName.d.size = qStack_e8;
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_f8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_f8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  key.def.fallBackFamilies.d.d = local_e0.d;
  key.def.fallBackFamilies.d.ptr = local_e0.ptr;
  key.def.fallBackFamilies.d.size = local_e0.size;
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  key.def.variableAxisValues.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
        )(QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
          )local_c8.d.ptr;
  if (local_c8.d.ptr !=
      (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
       *)0x0) {
    LOCK();
    *(int *)local_c8.d.ptr = *(int *)local_c8.d.ptr + 1;
    UNLOCK();
  }
  key.def._96_8_ = local_b0;
  key.def.pointSize = local_c0;
  key.def.pixelSize = dStack_b8;
  key._105_1_ = key._105_1_ & 0xfe;
  key.script = uVar4;
  this_00 = QFontCache::findEngine(this,&key);
  if (this_00 != (QFontEngine *)0x0) goto LAB_0025aa1e;
  if (script == 2) {
    bVar18 = 0;
  }
  else {
    bVar18 = family->writingSystems[1] & 1;
  }
  if (bVar18 == 1 && script < 0xab) {
    key.script = '\x02';
    this_00 = QFontCache::findEngine(this,&key);
    key.script = uVar4;
    if (this_00 != (QFontEngine *)0x0) {
      bVar7 = QFontEngine::supportsScript(this_00,script);
      if (bVar7) {
        this_00->isSmoothlyScalable = (bool)((byte)style->field_0x4 >> 1 & 1);
        QFontCache::insertEngine(this,&key,this_00,false);
      }
      else {
        QtPrivateLogging::lcFontDb();
        if (((byte)QtPrivateLogging::lcFontDb::category.field_2.bools.enabledInfo._q_value._M_base.
                   _M_i & 1) == 0) {
          this_00 = (QFontEngine *)0x0;
        }
        else {
          local_130[0] = '\x02';
          local_130[1] = '\0';
          local_130[2] = '\0';
          local_130[3] = '\0';
          local_130[0x14] = '\0';
          local_130[0x15] = '\0';
          local_130[0x16] = '\0';
          local_130[0x17] = '\0';
          local_130[4] = '\0';
          local_130[5] = '\0';
          local_130[6] = '\0';
          local_130[7] = '\0';
          local_130[8] = '\0';
          local_130[9] = '\0';
          local_130[10] = '\0';
          local_130[0xb] = '\0';
          local_130[0xc] = '\0';
          local_130[0xd] = '\0';
          local_130[0xe] = '\0';
          local_130[0xf] = '\0';
          local_130[0x10] = '\0';
          local_130[0x11] = '\0';
          local_130[0x12] = '\0';
          local_130[0x13] = '\0';
          local_118 = QtPrivateLogging::lcFontDb::category.name;
          uVar12 = QString::utf16();
          this_00 = (QFontEngine *)0x0;
          QMessageLogger::info
                    (local_130,"OpenType support missing for \"%ls\", script %d",uVar12,script);
        }
      }
      goto LAB_0025aa1e;
    }
  }
  uVar5 = *(uint3 *)&style->key;
  if (((uVar5 < 0x1000) || (uVar10 = *(ulong *)&request->field_0x60, (uVar10 & 0xfff0000) == 0)) ||
     ((lVar13 = (request->styleName).d.size, lVar13 != 0 &&
      ((lVar3 = (style->styleName).d.size, lVar13 == lVar3 &&
       (QVar19.m_data = (style->styleName).d.ptr, QVar19.m_size = lVar3,
       QVar20.m_data = (request->styleName).d.ptr, QVar20.m_size = lVar13,
       cVar6 = QtPrivate::equalStrings(QVar20,QVar19), cVar6 != '\0')))))) {
    if ((*(ushort *)&request->field_0x62 & 0xfff) == 0) {
      uVar10 = 0x640000;
      goto LAB_0025ac26;
    }
  }
  else {
    iVar8 = (int)((uint)uVar5 << 8) >> 0x14;
    uVar10 = (ulong)(((int)(iVar8 / 2 + ((uint)uVar10 >> 0x10 & 0xfff) * 100) / iVar8 & 0xfffU) <<
                    0x10);
LAB_0025ac26:
    local_b0 = local_b0 & 0xfffffffff000ffff | uVar10;
  }
  this_00 = (QFontEngine *)(**(code **)(*plVar9 + 0x40))(plVar9,&local_110,size->handle);
  if (this_00 != (QFontEngine *)0x0) {
    if ((0xaa < script) || (bVar7 = QFontEngine::supportsScript(this_00,script), bVar7)) {
      this_00->isSmoothlyScalable = (bool)((byte)style->field_0x4 >> 1 & 1);
      QFontCache::insertEngine(this,&key,this_00,false);
      if ((bVar18 != 0) && (this_00->symbol == false)) {
        key.script = '\x02';
        pQVar11 = QFontCache::findEngine(this,&key);
        if (pQVar11 == (QFontEngine *)0x0) {
          QFontCache::insertEngine(this,&key,this_00,false);
        }
      }
    }
    else {
      QtPrivateLogging::lcFontDb();
      if (((byte)QtPrivateLogging::lcFontDb::category.field_2.bools.enabledInfo._q_value._M_base.
                 _M_i & 1) != 0) {
        local_130[0] = '\x02';
        local_130[1] = '\0';
        local_130[2] = '\0';
        local_130[3] = '\0';
        local_130[0x14] = '\0';
        local_130[0x15] = '\0';
        local_130[0x16] = '\0';
        local_130[0x17] = '\0';
        local_130[4] = '\0';
        local_130[5] = '\0';
        local_130[6] = '\0';
        local_130[7] = '\0';
        local_130[8] = '\0';
        local_130[9] = '\0';
        local_130[10] = '\0';
        local_130[0xb] = '\0';
        local_130[0xc] = '\0';
        local_130[0xd] = '\0';
        local_130[0xe] = '\0';
        local_130[0xf] = '\0';
        local_130[0x10] = '\0';
        local_130[0x11] = '\0';
        local_130[0x12] = '\0';
        local_130[0x13] = '\0';
        local_118 = QtPrivateLogging::lcFontDb::category.name;
        uVar12 = QString::utf16();
        QMessageLogger::info
                  (local_130,"OpenType support missing for \"%ls\", script %d",uVar12,script);
      }
      if ((this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_00->_vptr_QFontEngine[1])(this_00);
      }
      this_00 = (QFontEngine *)0x0;
    }
  }
LAB_0025aa1e:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&key.def.variableAxisValues.d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&key.def.fallBackFamilies.d);
  if (key.def.styleName.d.d != (Data *)0x0) {
    LOCK();
    ((key.def.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((key.def.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((key.def.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(key.def.styleName.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&key);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_c8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_e0);
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_f8,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QFontEngine *QFontDatabasePrivate::loadSingleEngine(int script,
                              const QFontDef &request,
                              QtFontFamily *family, QtFontFoundry *foundry,
                              QtFontStyle *style, QtFontSize *size)
{
    Q_UNUSED(foundry);

    Q_ASSERT(size);
    QPlatformFontDatabase *pfdb = QGuiApplicationPrivate::platformIntegration()->fontDatabase();
    int pixelSize = size->pixelSize;
    if (!pixelSize || (style->smoothScalable && pixelSize == SMOOTH_SCALABLE)
        || pfdb->fontsAlwaysScalable()) {
        pixelSize = request.pixelSize;
    }

    QFontDef def = request;
    def.pixelSize = pixelSize;

    QFontCache *fontCache = QFontCache::instance();

    QFontCache::Key key(def,script);
    QFontEngine *engine = fontCache->findEngine(key);
    if (!engine) {
        const bool cacheForCommonScript = script != QFontDatabasePrivate::Script_Common
                && (family->writingSystems[QFontDatabase::Latin] & QtFontFamily::Supported) != 0;

        if (Q_LIKELY(cacheForCommonScript) && script < QChar::ScriptCount) {
            // fast path: check if engine was loaded for another script
            key.script = QChar::Script_Common;
            engine = fontCache->findEngine(key);
            key.script = script;
            if (engine) {
                // Also check for OpenType tables when using complex scripts
                if (Q_UNLIKELY(!engine->supportsScript(QChar::Script(script)))) {
                    qCInfo(lcFontDb, "OpenType support missing for \"%ls\", script %d",
                           qUtf16Printable(def.families.constFirst()), script);
                    return nullptr;
                }

                engine->isSmoothlyScalable = style->smoothScalable;
                fontCache->insertEngine(key, engine);
                return engine;
            }
        }

        // To avoid synthesized stretch we need a matching stretch to be 100 after this point.
        // If stretch didn't match exactly we need to calculate the new stretch factor.
        // This only done if not matched by styleName.
        if (style->key.stretch != 0 && request.stretch != 0
            && (request.styleName.isEmpty() || request.styleName != style->styleName)) {
            def.stretch = (request.stretch * 100 + style->key.stretch / 2) / style->key.stretch;
        } else if (request.stretch == QFont::AnyStretch) {
            def.stretch = 100;
        }

        engine = pfdb->fontEngine(def, size->handle);
        if (engine) {
            // Also check for OpenType tables when using complex scripts
            if (script < QChar::ScriptCount && !engine->supportsScript(QChar::Script(script))) {
                qCInfo(lcFontDb, "OpenType support missing for \"%ls\", script %d",
                       qUtf16Printable(def.families.constFirst()), script);
                if (engine->ref.loadRelaxed() == 0)
                    delete engine;
                return nullptr;
            }

            engine->isSmoothlyScalable = style->smoothScalable;
            fontCache->insertEngine(key, engine);

            if (Q_LIKELY(cacheForCommonScript && !engine->symbol)) {
                // cache engine for Common script as well
                key.script = QChar::Script_Common;
                if (!fontCache->findEngine(key))
                    fontCache->insertEngine(key, engine);
            }
        }
    }
    return engine;
}